

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loop_fusion.cpp
# Opt level: O2

void spvtools::opt::anon_unknown_21::GetDependences
               (vector<spvtools::opt::DistanceVector,_std::allocator<spvtools::opt::DistanceVector>_>
                *dependences,LoopDependenceAnalysis *analysis,
               vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
               *sources,vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                        *destinations,size_t num_entries)

{
  pointer ppIVar1;
  Instruction *source;
  pointer ppIVar2;
  Instruction *destination;
  bool bVar3;
  pointer ppIVar4;
  pointer ppIVar5;
  vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_> *__range3;
  DistanceVector dist;
  _Vector_base<spvtools::opt::DistanceEntry,_std::allocator<spvtools::opt::DistanceEntry>_> local_48
  ;
  
  ppIVar1 = (sources->
            super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
            )._M_impl.super__Vector_impl_data._M_finish;
  for (ppIVar4 = (sources->
                 super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                 )._M_impl.super__Vector_impl_data._M_start; ppIVar4 != ppIVar1;
      ppIVar4 = ppIVar4 + 1) {
    source = *ppIVar4;
    ppIVar2 = (destinations->
              super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
              )._M_impl.super__Vector_impl_data._M_finish;
    for (ppIVar5 = (destinations->
                   super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                   )._M_impl.super__Vector_impl_data._M_start; ppIVar5 != ppIVar2;
        ppIVar5 = ppIVar5 + 1) {
      destination = *ppIVar5;
      DistanceVector::DistanceVector((DistanceVector *)&local_48,num_entries);
      bVar3 = LoopDependenceAnalysis::GetDependence
                        (analysis,source,destination,(DistanceVector *)&local_48);
      if (!bVar3) {
        std::vector<spvtools::opt::DistanceVector,_std::allocator<spvtools::opt::DistanceVector>_>::
        push_back(dependences,(value_type *)&local_48);
      }
      std::_Vector_base<spvtools::opt::DistanceEntry,_std::allocator<spvtools::opt::DistanceEntry>_>
      ::~_Vector_base(&local_48);
    }
  }
  return;
}

Assistant:

void GetDependences(std::vector<DistanceVector>* dependences,
                    LoopDependenceAnalysis* analysis,
                    const std::vector<Instruction*>& sources,
                    const std::vector<Instruction*>& destinations,
                    size_t num_entries) {
  for (auto source : sources) {
    for (auto destination : destinations) {
      DistanceVector dist(num_entries);
      if (!analysis->GetDependence(source, destination, &dist)) {
        dependences->push_back(dist);
      }
    }
  }
}